

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_UuidIndex>::Append(ON_SimpleArray<ON_UuidIndex> *this,ON_UuidIndex *x)

{
  int iVar1;
  ON_UuidIndex *pOVar2;
  undefined8 uVar3;
  unsigned_short uVar4;
  unsigned_short uVar5;
  ON_UuidIndex *memblock;
  int iVar6;
  uint uVar7;
  
  iVar1 = this->m_count;
  memblock = x;
  if (iVar1 == this->m_capacity) {
    if ((iVar1 < 8) || ((ulong)((long)iVar1 * 0x14) < 0x10000001)) {
      uVar7 = 4;
      if (2 < iVar1) {
        uVar7 = iVar1 * 2;
      }
    }
    else {
      iVar6 = 0xccccd4;
      if (iVar1 < 0xccccd4) {
        iVar6 = iVar1;
      }
      uVar7 = iVar6 + iVar1;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_UuidIndex *)onmalloc(0x14);
      uVar4 = (x->m_id).Data2;
      uVar5 = (x->m_id).Data3;
      uVar3 = *(undefined8 *)(x->m_id).Data4;
      (memblock->m_id).Data1 = (x->m_id).Data1;
      (memblock->m_id).Data2 = uVar4;
      (memblock->m_id).Data3 = uVar5;
      *(undefined8 *)(memblock->m_id).Data4 = uVar3;
      memblock->m_i = x->m_i;
    }
    if ((uint)this->m_capacity < uVar7) {
      SetCapacity(this,(long)(int)uVar7);
    }
    if (this->m_a == (ON_UuidIndex *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  pOVar2 = this->m_a;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  pOVar2[iVar1].m_i = memblock->m_i;
  uVar4 = (memblock->m_id).Data2;
  uVar5 = (memblock->m_id).Data3;
  uVar3 = *(undefined8 *)(memblock->m_id).Data4;
  pOVar2 = pOVar2 + iVar1;
  (pOVar2->m_id).Data1 = (memblock->m_id).Data1;
  (pOVar2->m_id).Data2 = uVar4;
  (pOVar2->m_id).Data3 = uVar5;
  *(undefined8 *)(pOVar2->m_id).Data4 = uVar3;
  if (memblock != x) {
    onfree(memblock);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}